

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# max_prediction_degree_traverser.h
# Opt level: O0

int __thiscall
draco::
MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
::ComputePriority(MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                  *this,CornerIndex corner_id)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  *in_RDI;
  int degree;
  int priority;
  VertexIndex v_tip;
  TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  CornerIndex in_stack_ffffffffffffffe0;
  undefined4 local_1c;
  
  TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  ::corner_table(in_RDI);
  CornerTable::Vertex((CornerTable *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      in_stack_ffffffffffffffe0);
  local_1c = 0;
  bVar2 = TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
          ::IsVertexVisited(in_stack_ffffffffffffffc8,(VertexIndex)(uint)((ulong)in_RDI >> 0x20));
  if (!bVar2) {
    pvVar3 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
             operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                         *)in_RDI,
                        (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)
                        in_stack_ffffffffffffffc8);
    iVar1 = *pvVar3;
    *pvVar3 = iVar1 + 1;
    local_1c = 2;
    if (1 < iVar1 + 1) {
      local_1c = 1;
    }
  }
  if (2 < local_1c) {
    local_1c = 2;
  }
  return local_1c;
}

Assistant:

inline int ComputePriority(CornerIndex corner_id) {
    const VertexIndex v_tip = this->corner_table()->Vertex(corner_id);
    // Priority 0 when traversing to already visited vertices.
    int priority = 0;
    if (!this->IsVertexVisited(v_tip)) {
      const int degree = ++prediction_degree_[v_tip];
      // Priority 1 when prediction degree > 1, otherwise 2.
      priority = (degree > 1 ? 1 : 2);
    }
    // Clamp the priority to the maximum number of buckets.
    if (priority >= kMaxPriority) {
      priority = kMaxPriority - 1;
    }
    return priority;
  }